

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR eval_absolute_location_path(lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set,uint32_t options)

{
  int iVar1;
  uint32_t uVar2;
  LY_ERR LVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  ly_bool all_desc;
  undefined4 uVar7;
  char *local_38;
  
  if ((options & 0x20) != 0) {
    local_38 = "skipped";
    goto LAB_001b15d9;
  }
  if ((options & 0x1c) == 0) {
    lyxp_set_free_content(set);
    set_insert_node(set,(lyd_node *)0x0,0,set->root_type,0);
    set->non_child_axis = '\0';
LAB_001b15bb:
    LVar3 = LY_SUCCESS;
  }
  else {
    uVar4 = set->used;
    if ((ulong)uVar4 != 0) {
      lVar6 = 0;
      do {
        iVar1 = *(int *)((long)&((set->val).nodes)->pos + lVar6);
        uVar7 = 0;
        if (iVar1 == 2) {
LAB_001b155e:
          *(undefined4 *)((long)&((set->val).nodes)->pos + lVar6) = uVar7;
        }
        else if (iVar1 == -2) {
          uVar7 = 0xffffffff;
          goto LAB_001b155e;
        }
        lVar6 = lVar6 + 0x18;
      } while ((ulong)uVar4 * 0x18 != lVar6);
    }
    LVar3 = lyxp_set_scnode_insert_node
                      (set,(lysc_node *)0x0,set->root_type,LYXP_AXIS_SELF,(uint32_t *)0x0);
    if (LVar3 == LY_SUCCESS) goto LAB_001b15bb;
  }
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  local_38 = "parsed";
LAB_001b15d9:
  uVar2 = exp->tok_len[*tok_idx];
  pcVar5 = lyxp_token2str(exp->tokens[*tok_idx]);
  ly_log_dbg(2,"%-27s %s %s[%u]","eval_absolute_location_path",local_38,pcVar5,
             (ulong)exp->tok_pos[*tok_idx]);
  uVar4 = *tok_idx + 1;
  *tok_idx = uVar4;
  if (uVar2 == 1) {
    if (exp->used == uVar4) {
      return LY_SUCCESS;
    }
    if (LYXP_TOKEN_AXISNAME < exp->tokens[uVar4]) {
      return LY_SUCCESS;
    }
    if ((0x400ce0U >> (exp->tokens[uVar4] & (LYXP_TOKEN_NUMBER|LYXP_TOKEN_AT)) & 1) == 0) {
      return LY_SUCCESS;
    }
    all_desc = '\0';
  }
  else {
    all_desc = '\x01';
  }
  LVar3 = eval_relative_location_path(exp,tok_idx,all_desc,set,options);
  if (LVar3 == LY_SUCCESS) {
    return LY_SUCCESS;
  }
  return LVar3;
}

Assistant:

static LY_ERR
eval_absolute_location_path(const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set, uint32_t options)
{
    ly_bool all_desc;

    if (!(options & LYXP_SKIP_EXPR)) {
        /* no matter what tokens follow, we need to be at the root */
        LY_CHECK_RET(moveto_root(set, options));
    }

    /* '/' RelativeLocationPath? */
    if (exp->tok_len[*tok_idx] == 1) {
        /* evaluate '/' - deferred */
        all_desc = 0;
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

        if (lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_NONE)) {
            return LY_SUCCESS;
        }
        switch (exp->tokens[*tok_idx]) {
        case LYXP_TOKEN_DOT:
        case LYXP_TOKEN_DDOT:
        case LYXP_TOKEN_AXISNAME:
        case LYXP_TOKEN_AT:
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            LY_CHECK_RET(eval_relative_location_path(exp, tok_idx, all_desc, set, options));
            break;
        default:
            break;
        }

    } else {
        /* '//' RelativeLocationPath */
        /* evaluate '//' - deferred so as not to waste memory by remembering all the nodes */
        all_desc = 1;
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

        LY_CHECK_RET(eval_relative_location_path(exp, tok_idx, all_desc, set, options));
    }

    return LY_SUCCESS;
}